

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::full_formatter::full_formatter(full_formatter *this,padding_info padinfo)

{
  padding_info padinfo_00;
  undefined8 in_RDX;
  size_t in_RSI;
  flag_formatter *in_RDI;
  allocator<char> *alloc;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_00;
  int local_2c;
  
  padinfo_00._8_8_ = in_RDX;
  padinfo_00.width_ = in_RSI;
  flag_formatter::flag_formatter(in_RDI,padinfo_00);
  in_RDI->_vptr_flag_formatter = (_func_int **)&PTR__full_formatter_0023d790;
  local_2c = 0;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)(in_RDI + 1),&stack0xffffffffffffffd4);
  alloc = (allocator<char> *)&in_RDI[1].padinfo_;
  this_00 = (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)&stack0xffffffffffffffc3;
  std::allocator<char>::allocator();
  fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
            (this_00,alloc);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc3);
  return;
}

Assistant:

explicit full_formatter(padding_info padinfo)
        : flag_formatter(padinfo) {}